

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::make_multiple_of_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *context,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *parent)

{
  bool bVar1;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  uri *in_RDI;
  type_conflict1 value;
  string message;
  uri schema_location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  schema_error *in_stack_fffffffffffffe10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  _Head_base<0UL,_jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
  __args;
  allocator<char> local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  type_conflict1 local_168;
  undefined1 local_159;
  allocator<char> local_111 [17];
  undefined8 in_stack_ffffffffffffff00;
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff08;
  allocator<char> local_d9;
  string local_d8 [32];
  uri local_b8;
  
  __args._M_head_impl =
       (multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        *)in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)__args._M_head_impl,(allocator<char> *)in_RDI);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  make_schema_location(in_stack_ffffffffffffff08,(string *)in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                    (in_stack_fffffffffffffe18);
  if (!bVar1) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,(char *)__args._M_head_impl,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_111);
    local_159 = 1;
    __rhs = (char *)__cxa_allocate_exception(0x18);
    jsoncons::uri::string_abi_cxx11_(&local_b8);
    std::operator+(__lhs,__rhs);
    std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    schema_error::schema_error(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_159 = 0;
    __cxa_throw(__rhs,&schema_error::typeinfo,schema_error::~schema_error);
  }
  local_168 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffe00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)__args._M_head_impl,(allocator<char> *)in_RDI);
  compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  get_custom_message(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  std::
  make_unique<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::uri&,std::__cxx11::string,double&>
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__args._M_head_impl
             ,in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe28,(double *)in_stack_fffffffffffffe20);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  jsoncons::uri::~uri((uri *)0x831776);
  return (__uniq_ptr_data<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::multiple_of_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )__args._M_head_impl;
}

Assistant:

std::unique_ptr<multiple_of_validator<Json>> make_multiple_of_validator(const compilation_context<Json>& context, 
            const Json& sch, const Json& parent)
        {
            uri schema_location = context.make_schema_location("multipleOf");
            if (!sch.is_number())
            {
                const std::string message("multipleOf must be a number value");
                JSONCONS_THROW(schema_error(schema_location.string() + ": " + message));
            }
            auto value = sch.template as<double>();
            return jsoncons::make_unique<multiple_of_validator<Json>>(parent, schema_location, 
                context.get_custom_message("multipleOf"), value);
        }